

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.hxx
# Opt level: O2

void __thiscall
nuraft::FakeNetwork::ReqPkg::ReqPkg(ReqPkg *this,ptr<req_msg> *_req,rpc_handler *_when_done)

{
  std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)this,
             &_req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(&this->whenDone,_when_done);
  return;
}

Assistant:

ReqPkg(ptr<req_msg>& _req, rpc_handler& _when_done)
            : req(_req), whenDone(_when_done)
            {}